

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::WindowDataParameter::MergePartialFromCodedStream
          (WindowDataParameter *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  void *pvVar3;
  uint8 *puVar4;
  float *pfVar5;
  bool bVar6;
  uint32 uVar7;
  byte *pbVar8;
  long lVar9;
  char *field_name;
  UnknownFieldSet *unknown_fields;
  int iVar10;
  pointer data;
  char cVar11;
  uint tag;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  pair<unsigned_long,_bool> pVar14;
  float local_54;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_38 = &this->root_folder_;
  local_40 = &this->crop_mode_;
  local_48 = &this->mean_file_;
  local_50 = &this->source_;
  do {
    pbVar8 = input->buffer_;
    uVar7 = 0;
    if (pbVar8 < input->buffer_end_) {
      bVar1 = *pbVar8;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b2541;
      input->buffer_ = pbVar8 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b2541:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_003b25c2_default;
    cVar11 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if ((this->source_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_50,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      }
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,local_50->ptr_);
      iVar10 = 6;
      if (bVar6) {
        data = (local_50->ptr_->_M_dataplus)._M_p;
        iVar10 = (int)local_50->ptr_->_M_string_length;
        field_name = "caffe.WindowDataParameter.source";
LAB_003b2906:
        google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,iVar10,PARSE,field_name);
        goto LAB_003b259e;
      }
      goto LAB_003b25a0;
    case 2:
      if (cVar11 != '\x15') break;
      pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar8 = *pbVar8 | 2;
      pfVar5 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
        bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_54);
        if (!bVar6) {
LAB_003b2a39:
          iVar10 = 6;
          goto LAB_003b25a0;
        }
      }
      else {
        local_54 = *pfVar5;
        input->buffer_ = (uint8 *)(pfVar5 + 1);
      }
      this->scale_ = local_54;
      goto LAB_003b259e;
    case 3:
      if (cVar11 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if ((this->mean_file_).ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_48,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,local_48->ptr_);
        iVar10 = 6;
        if (bVar6) {
          data = (local_48->ptr_->_M_dataplus)._M_p;
          iVar10 = (int)local_48->ptr_->_M_string_length;
          field_name = "caffe.WindowDataParameter.mean_file";
          goto LAB_003b2906;
        }
        goto LAB_003b25a0;
      }
      break;
    case 4:
      if (cVar11 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->batch_size_ = (uint)bVar1;
LAB_003b27ac:
            input->buffer_ = pbVar8 + 1;
            goto LAB_003b259e;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->batch_size_ = (uint32)lVar9;
LAB_003b29ce:
        iVar10 = 6;
        if (-1 < lVar9) goto LAB_003b259e;
        goto LAB_003b25a0;
      }
      break;
    case 5:
      if (cVar11 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->crop_size_ = (uint)bVar1;
            goto LAB_003b27ac;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->crop_size_ = (uint32)lVar9;
        goto LAB_003b29ce;
      }
      break;
    case 6:
      if (cVar11 == '0') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar14._8_8_ = 1;
          pVar14.first = (long)(char)uVar2;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->mirror_ = pVar14.first != 0;
          goto LAB_003b259e;
        }
        goto LAB_003b25a0;
      }
      break;
    case 7:
      if (cVar11 == '=') {
        pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar8 = *pbVar8 | 4;
        pfVar5 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_54);
          if (!bVar6) goto LAB_003b2a39;
        }
        else {
          local_54 = *pfVar5;
          input->buffer_ = (uint8 *)(pfVar5 + 1);
        }
        this->fg_threshold_ = local_54;
        goto LAB_003b259e;
      }
      break;
    case 8:
      if (cVar11 == 'E') {
        pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar8 = *pbVar8 | 8;
        pfVar5 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_54);
          if (!bVar6) goto LAB_003b2a39;
        }
        else {
          local_54 = *pfVar5;
          input->buffer_ = (uint8 *)(pfVar5 + 1);
        }
        this->bg_threshold_ = local_54;
        goto LAB_003b259e;
      }
      break;
    case 9:
      if (cVar11 == 'M') {
        pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar8 = *pbVar8 | 0x10;
        pfVar5 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_54);
          if (!bVar6) goto LAB_003b2a39;
        }
        else {
          local_54 = *pfVar5;
          input->buffer_ = (uint8 *)(pfVar5 + 1);
        }
        this->fg_fraction_ = local_54;
        goto LAB_003b259e;
      }
      break;
    case 10:
      if (cVar11 == 'P') {
        pbVar8 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar8 = *pbVar8 | 1;
        pbVar8 = input->buffer_;
        if (pbVar8 < input->buffer_end_) {
          bVar1 = *pbVar8;
          uVar7 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->context_pad_ = (uint)bVar1;
            goto LAB_003b27ac;
          }
        }
        else {
          uVar7 = 0;
        }
        lVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        this->context_pad_ = (uint32)lVar9;
        goto LAB_003b29ce;
      }
      break;
    case 0xb:
      if (cVar11 == 'Z') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        if ((this->crop_mode_).ptr_ == (string *)&_default_crop_mode__abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_40,(string *)&_default_crop_mode__abi_cxx11_);
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,local_40->ptr_);
        iVar10 = 6;
        if (bVar6) {
          data = (local_40->ptr_->_M_dataplus)._M_p;
          iVar10 = (int)local_40->ptr_->_M_string_length;
          field_name = "caffe.WindowDataParameter.crop_mode";
          goto LAB_003b2906;
        }
        goto LAB_003b25a0;
      }
      break;
    case 0xc:
      if (cVar11 == '`') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar13._8_8_ = 1;
          pVar13.first = (long)(char)uVar2;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->cache_images_ = pVar13.first != 0;
          goto LAB_003b259e;
        }
        goto LAB_003b25a0;
      }
      break;
    case 0xd:
      if (cVar11 == 'j') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        if ((this->root_folder_).ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_38,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,local_38->ptr_);
        iVar10 = 6;
        if (bVar6) {
          data = (local_38->ptr_->_M_dataplus)._M_p;
          iVar10 = (int)local_38->ptr_->_M_string_length;
          field_name = "caffe.WindowDataParameter.root_folder";
          goto LAB_003b2906;
        }
        goto LAB_003b25a0;
      }
    }
switchD_003b25c2_default:
    iVar10 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar3 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar6 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
      iVar10 = 6;
      if (bVar6) {
LAB_003b259e:
        iVar10 = 0;
      }
    }
LAB_003b25a0:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool WindowDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.WindowDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string mean_file = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_mean_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->mean_file().data(), this->mean_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.mean_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 crop_size = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_crop_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &crop_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool mirror = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_mirror();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &mirror_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float fg_threshold = 7 [default = 0.5];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(61u)) {
          set_has_fg_threshold();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &fg_threshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float bg_threshold = 8 [default = 0.5];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(69u)) {
          set_has_bg_threshold();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &bg_threshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float fg_fraction = 9 [default = 0.25];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(77u)) {
          set_has_fg_fraction();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &fg_fraction_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 context_pad = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_context_pad();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &context_pad_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string crop_mode = 11 [default = "warp"];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_crop_mode()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->crop_mode().data(), this->crop_mode().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.crop_mode");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cache_images = 12 [default = false];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          set_has_cache_images();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cache_images_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string root_folder = 13 [default = ""];
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_root_folder()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->root_folder().data(), this->root_folder().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.root_folder");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.WindowDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.WindowDataParameter)
  return false;
#undef DO_
}